

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frameutils.cpp
# Opt level: O3

frame * frame_from_string(frame *__return_storage_ptr__,string *s)

{
  long *local_48 [2];
  long local_38 [2];
  
  (__return_storage_ptr__->addr)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->addr).field_2
  ;
  (__return_storage_ptr__->addr)._M_string_length = 0;
  (__return_storage_ptr__->addr).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->func)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->func).field_2
  ;
  (__return_storage_ptr__->func)._M_string_length = 0;
  (__return_storage_ptr__->func).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->data)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->data).field_2
  ;
  (__return_storage_ptr__->data)._M_string_length = 0;
  (__return_storage_ptr__->data).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->crc)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->crc).field_2;
  (__return_storage_ptr__->crc)._M_string_length = 0;
  (__return_storage_ptr__->crc).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::substr((ulong)local_48,(ulong)s);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->crc,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  std::__cxx11::string::substr((ulong)local_48,(ulong)s);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  std::__cxx11::string::substr((ulong)local_48,(ulong)s);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->func,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  std::__cxx11::string::substr((ulong)local_48,(ulong)s);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->data,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

frame frame_from_string(string s) {
	frame result;
	long len = s.size();
	result.crc = s.substr(len - 16, 16);
	result.addr = s.substr(0, 8);
	result.func = s.substr(8, 8);
	result.data = s.substr(16, len - 32);
	return result;
}